

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_encoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalEncoder::MeshEdgebreakerTraversalEncoder
          (MeshEdgebreakerTraversalEncoder *this)

{
  RAnsBitEncoder::RAnsBitEncoder(&this->start_face_encoder_);
  EncoderBuffer::EncoderBuffer(&this->traversal_buffer_);
  *(undefined8 *)
   ((long)&(this->symbols_).
           super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->attribute_connectivity_encoders_)._M_t.
           super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>
           .super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl + 4) = 0;
  (this->symbols_).
  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->symbols_).
  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->encoder_impl_ = (MeshEdgebreakerEncoderImplInterface *)0x0;
  (this->symbols_).
  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

MeshEdgebreakerTraversalEncoder()
      : encoder_impl_(nullptr),
        attribute_connectivity_encoders_(nullptr),
        num_attribute_data_(0) {}